

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.h
# Opt level: O2

void __thiscall
kj::_::
RunnableImpl<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-test.c++:917:3)>
::run(RunnableImpl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_io_test_c__:917:3)>
      *this)

{
  AsyncOutputStream *pAVar1;
  Own<kj::_::PromiseNode> local_20;
  
  pAVar1 = (((this->func).pipe)->out).ptr;
  (**pAVar1->_vptr_AsyncOutputStream)(&local_20,pAVar1,"baz",3);
  Promise<void>::wait((Promise<void> *)&local_20,(this->func).ws);
  Own<kj::_::PromiseNode>::dispose(&local_20);
  return;
}

Assistant:

void run() override {
    func();
  }